

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing_sse2.c
# Opt level: O0

void AlphaReplace_SSE2(uint32_t *src,int length,uint32_t color)

{
  undefined8 *puVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong *puVar6;
  long lVar7;
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  __m128i a1;
  __m128i a0;
  int i;
  __m128i zero;
  __m128i m_color;
  int local_1fc;
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  __m128i e1;
  __m128i e0;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  
  for (local_1fc = 0; local_1fc + 8 <= in_ESI; local_1fc = local_1fc + 8) {
    puVar6 = (ulong *)(in_RDI + (long)local_1fc * 4);
    uVar2 = *puVar6;
    uVar3 = puVar6[1];
    puVar1 = (undefined8 *)(in_RDI + 0x10 + (long)local_1fc * 4);
    uVar4 = *puVar1;
    uVar5 = puVar1[1];
    local_98 = (int)uVar2;
    iStack_94 = (int)(uVar2 >> 0x20);
    iStack_90 = (int)uVar3;
    iStack_8c = (int)(uVar3 >> 0x20);
    auVar16 = ZEXT416(0x18);
    local_b8 = (uint)uVar4;
    uStack_b4 = (uint)((ulong)uVar4 >> 0x20);
    uStack_b0 = (uint)uVar5;
    uStack_ac = (uint)((ulong)uVar5 >> 0x20);
    auVar17 = ZEXT416(0x18);
    iVar8 = -(uint)(local_98 >> auVar16 == 0);
    iVar10 = -(uint)(iStack_94 >> auVar16 == 0);
    iVar12 = -(uint)(iStack_90 >> auVar16 == 0);
    iVar14 = -(uint)(iStack_8c >> auVar16 == 0);
    uVar9 = -(uint)((int)local_b8 >> auVar17 == 0);
    uVar11 = -(uint)((int)uStack_b4 >> auVar17 == 0);
    uVar13 = -(uint)((int)uStack_b0 >> auVar17 == 0);
    uVar15 = -(uint)((int)uStack_ac >> auVar17 == 0);
    puVar6 = (ulong *)(in_RDI + (long)local_1fc * 4);
    *puVar6 = CONCAT44(iVar10,iVar8) & CONCAT44(in_EDX,in_EDX) | ~CONCAT44(iVar10,iVar8) & uVar2;
    puVar6[1] = CONCAT44(iVar14,iVar12) & CONCAT44(in_EDX,in_EDX) | ~CONCAT44(iVar14,iVar12) & uVar3
    ;
    lVar7 = in_RDI + (long)local_1fc * 4;
    *(ulong *)(lVar7 + 0x10) =
         CONCAT44(uVar11,uVar9) & CONCAT44(in_EDX,in_EDX) |
         CONCAT44((uVar11 ^ 0xffffffff) & uStack_b4,(uVar9 ^ 0xffffffff) & local_b8);
    *(ulong *)(lVar7 + 0x18) =
         CONCAT44(uVar15,uVar13) & CONCAT44(in_EDX,in_EDX) |
         CONCAT44((uVar15 ^ 0xffffffff) & uStack_ac,(uVar13 ^ 0xffffffff) & uStack_b0);
  }
  for (; local_1fc < in_ESI; local_1fc = local_1fc + 1) {
    if (*(uint *)(in_RDI + (long)local_1fc * 4) >> 0x18 == 0) {
      *(undefined4 *)(in_RDI + (long)local_1fc * 4) = in_EDX;
    }
  }
  return;
}

Assistant:

static void AlphaReplace_SSE2(uint32_t* src, int length, uint32_t color) {
  const __m128i m_color = _mm_set1_epi32(color);
  const __m128i zero = _mm_setzero_si128();
  int i = 0;
  for (; i + 8 <= length; i += 8) {
    const __m128i a0 = _mm_loadu_si128((const __m128i*)(src + i + 0));
    const __m128i a1 = _mm_loadu_si128((const __m128i*)(src + i + 4));
    const __m128i b0 = _mm_srai_epi32(a0, 24);
    const __m128i b1 = _mm_srai_epi32(a1, 24);
    const __m128i c0 = _mm_cmpeq_epi32(b0, zero);
    const __m128i c1 = _mm_cmpeq_epi32(b1, zero);
    const __m128i d0 = _mm_and_si128(c0, m_color);
    const __m128i d1 = _mm_and_si128(c1, m_color);
    const __m128i e0 = _mm_andnot_si128(c0, a0);
    const __m128i e1 = _mm_andnot_si128(c1, a1);
    _mm_storeu_si128((__m128i*)(src + i + 0), _mm_or_si128(d0, e0));
    _mm_storeu_si128((__m128i*)(src + i + 4), _mm_or_si128(d1, e1));
  }
  for (; i < length; ++i) if ((src[i] >> 24) == 0) src[i] = color;
}